

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9AbsCreate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  uint uVar6;
  char *pcVar7;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"vh"), iVar3 == 0x76) {
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (iVar3 == -1) {
    pGVar1 = pAbc->pGia;
    if (pGVar1 != (Gia_Man_t *)0x0) {
      uVar4 = pGVar1->nRegs;
      if ((long)(int)uVar4 == 0) {
        pcVar7 = "The network is combinational.\n";
      }
      else if (pGVar1->vFlopClasses == (Vec_Int_t *)0x0) {
        pVVar5 = (Vec_Int_t *)malloc(0x10);
        uVar6 = 0x10;
        if (0x10 < uVar4) {
          uVar6 = uVar4;
        }
        pVVar5->nCap = uVar6;
        __s = (int *)malloc((long)(int)uVar6 << 2);
        pVVar5->pArray = __s;
        pVVar5->nSize = uVar4;
        if (__s != (int *)0x0) {
          memset(__s,0,(long)(int)uVar4 << 2);
        }
        pGVar1->vFlopClasses = pVVar5;
        if (globalUtilOptind + 1 == argc) {
          pcVar7 = strtok(argv[globalUtilOptind]," ,");
          if (pcVar7 == (char *)0x0) {
            return 0;
          }
          do {
            uVar4 = atoi(pcVar7);
            if (((int)uVar4 < 0) || (pAbc->pGia->nRegs <= (int)uVar4)) {
              __assert_fail("iFlop >= 0 && iFlop < Gia_ManRegNum(pAbc->pGia)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                            ,0xb66e,"int Abc_CommandAbc9AbsCreate(Abc_Frame_t *, int, char **)");
            }
            pVVar5 = pAbc->pGia->vFlopClasses;
            if (pVVar5->nSize <= (int)uVar4) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar5->pArray[uVar4] = 1;
            pcVar7 = strtok((char *)0x0," ,");
          } while (pcVar7 != (char *)0x0);
          return 0;
        }
        pcVar7 = "Flop list should be specified on the command line.\n";
      }
      else {
        pcVar7 = "Abstraction flop map is already defined.\n";
      }
      Abc_Print(-1,pcVar7);
      return 0;
    }
    pcVar7 = "Abc_CommandAbc9AbsCreate(): There is no AIG.\n";
    iVar3 = -1;
  }
  else {
    Abc_Print(-2,"usage: &abs_create [-vh] <comma-separated_list_of_zero-based_flop_ids>\n");
    Abc_Print(-2,"\t        creates new flop map by reading user\'s input\n");
    pcVar7 = "yes";
    if (!bVar2) {
      pcVar7 = "no";
    }
    Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar7);
    pcVar7 = "\t-h    : print the command usage\n";
    iVar3 = -2;
  }
  Abc_Print(iVar3,pcVar7);
  return 1;
}

Assistant:

int Abc_CommandAbc9AbsCreate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    //Gia_Man_t * pTemp = NULL;
    char * pStr, * pFlopNum;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9AbsCreate(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pAbc->pGia->vFlopClasses != NULL )
    {
        Abc_Print( -1, "Abstraction flop map is already defined.\n" );
        return 0;
    }
    pAbc->pGia->vFlopClasses = Vec_IntStart( Gia_ManRegNum(pAbc->pGia) );
    // read the flop list
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Flop list should be specified on the command line.\n" );
        return 0;
    }
    pStr = argv[globalUtilOptind];
    // parse flop list
    pFlopNum = strtok( pStr, " ," );
    while ( pFlopNum )
    {
        int iFlop = atoi(pFlopNum);
        assert( iFlop >= 0 && iFlop < Gia_ManRegNum(pAbc->pGia) );
        Vec_IntWriteEntry( pAbc->pGia->vFlopClasses, iFlop, 1 );
        pFlopNum = strtok( NULL, " ," );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &abs_create [-vh] <comma-separated_list_of_zero-based_flop_ids>\n" );
    Abc_Print( -2, "\t        creates new flop map by reading user's input\n" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}